

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void btreeLockCarefully(Btree *p)

{
  sqlite3_mutex *psVar1;
  int iVar2;
  Btree *p_00;
  
  psVar1 = p->pBt->mutex;
  if ((psVar1 != (sqlite3_mutex *)0x0) &&
     (iVar2 = (*sqlite3Config.mutex.xMutexTry)(psVar1), iVar2 != 0)) {
    for (p_00 = p->pNext; p_00 != (Btree *)0x0; p_00 = p_00->pNext) {
      if (p_00->locked != '\0') {
        unlockBtreeMutex(p_00);
      }
    }
    do {
      psVar1 = p->pBt->mutex;
      if (psVar1 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(psVar1);
      }
      p->pBt->db = p->db;
      p->locked = '\x01';
      do {
        p = p->pNext;
        if (p == (Btree *)0x0) {
          return;
        }
      } while (p->wantToLock == 0);
    } while( true );
  }
  p->pBt->db = p->db;
  p->locked = '\x01';
  return;
}

Assistant:

static void SQLITE_NOINLINE btreeLockCarefully(Btree *p){
  Btree *pLater;

  /* In most cases, we should be able to acquire the lock we
  ** want without having to go through the ascending lock
  ** procedure that follows.  Just be sure not to block.
  */
  if( sqlite3_mutex_try(p->pBt->mutex)==SQLITE_OK ){
    p->pBt->db = p->db;
    p->locked = 1;
    return;
  }

  /* To avoid deadlock, first release all locks with a larger
  ** BtShared address.  Then acquire our lock.  Then reacquire
  ** the other BtShared locks that we used to hold in ascending
  ** order.
  */
  for(pLater=p->pNext; pLater; pLater=pLater->pNext){
    assert( pLater->sharable );
    assert( pLater->pNext==0 || pLater->pNext->pBt>pLater->pBt );
    assert( !pLater->locked || pLater->wantToLock>0 );
    if( pLater->locked ){
      unlockBtreeMutex(pLater);
    }
  }
  lockBtreeMutex(p);
  for(pLater=p->pNext; pLater; pLater=pLater->pNext){
    if( pLater->wantToLock ){
      lockBtreeMutex(pLater);
    }
  }
}